

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  bool bVar1;
  cmLinkImplementation *libs;
  pointer pvVar2;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_00;
  reference item;
  cmLinkItem *wi;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
  local_40;
  const_iterator runtimeEntries;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmLinkImplementation *impl;
  cmComputeLinkDepends *this_local;
  
  libs = cmGeneratorTarget::GetLinkImplementation(this->Target,&this->Config,Link);
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libs);
  AddLinkObjects(this,&(libs->super_cmLinkImplementationLibraries).Objects);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&libs->Languages);
  language = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&libs->Languages);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&language), bVar1) {
    runtimeEntries.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
               )__gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
         ::find(&libs->LanguageRuntimeLibraries,
                (key_type *)
                runtimeEntries.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                ._M_cur);
    __range1_1 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
                 ::end(&libs->LanguageRuntimeLibraries);
    bVar1 = std::__detail::operator!=
                      (&local_40,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                        *)&__range1_1);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_false,_true>
                             *)&local_40);
      AddLinkEntries<cmLinkImplItem>(this,-1,&pvVar2->second);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = &(libs->super_cmLinkImplementationLibraries).WrongConfigLibraries;
  __end1_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(this_00);
  wi = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                             *)&wi), bVar1) {
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
           ::operator*(&__end1_1);
    CheckWrongConfigItem(this,item);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&__end1_1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmLinkImplementation const* impl = this->Target->GetLinkImplementation(
    this->Config, cmGeneratorTarget::LinkInterfaceFor::Link);
  this->AddLinkEntries(-1, impl->Libraries);
  this->AddLinkObjects(impl->Objects);

  for (auto const& language : impl->Languages) {
    auto runtimeEntries = impl->LanguageRuntimeLibraries.find(language);
    if (runtimeEntries != impl->LanguageRuntimeLibraries.end()) {
      this->AddLinkEntries(-1, runtimeEntries->second);
    }
  }
  for (cmLinkItem const& wi : impl->WrongConfigLibraries) {
    this->CheckWrongConfigItem(wi);
  }
}